

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O2

void __thiscall cmLocalCommonGenerator::SetConfigName(cmLocalCommonGenerator *this)

{
  cmMakefile *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (this->super_cmLocalGenerator).Makefile;
  std::__cxx11::string::string((string *)&local_38,"CMAKE_BUILD_TYPE",&local_39);
  cmMakefile::GetDefinition(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::assign((char *)&this->ConfigName);
  return;
}

Assistant:

void cmLocalCommonGenerator::SetConfigName()
{
  // Store the configuration name that will be generated.
  if(const char* config = this->Makefile->GetDefinition("CMAKE_BUILD_TYPE"))
    {
    // Use the build type given by the user.
    this->ConfigName = config;
    }
  else
    {
    // No configuration type given.
    this->ConfigName = "";
    }
}